

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

void add_pair_to_block(EState *s)

{
  int iVar1;
  UChar UVar2;
  int local_14;
  UChar ch;
  Int32 i;
  EState *s_local;
  
  UVar2 = (UChar)s->state_in_ch;
  for (local_14 = 0; local_14 < s->state_in_len; local_14 = local_14 + 1) {
    s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[s->blockCRC >> 0x18 ^ s->state_in_ch & 0xff];
  }
  s->inUse[s->state_in_ch] = '\x01';
  iVar1 = s->state_in_len;
  if (iVar1 == 1) {
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
  }
  else if (iVar1 == 2) {
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
  }
  else if (iVar1 == 3) {
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
  }
  else {
    s->inUse[s->state_in_len + -4] = '\x01';
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = UVar2;
    s->nblock = s->nblock + 1;
    s->block[s->nblock] = (char)s->state_in_len + 0xfc;
    s->nblock = s->nblock + 1;
  }
  return;
}

Assistant:

static
void add_pair_to_block ( EState* s )
{
   Int32 i;
   UChar ch = (UChar)(s->state_in_ch);
   for (i = 0; i < s->state_in_len; i++) {
      BZ_UPDATE_CRC( s->blockCRC, ch );
   }
   s->inUse[s->state_in_ch] = True;
   switch (s->state_in_len) {
      case 1:
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         break;
      case 2:
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         break;
      case 3:
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         break;
      default:
         s->inUse[s->state_in_len-4] = True;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = (UChar)ch; s->nblock++;
         s->block[s->nblock] = ((UChar)(s->state_in_len-4));
         s->nblock++;
         break;
   }
}